

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O3

void ncnn::innerproduct_fp16s_pack8_avx_f16c
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  int iVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  float *pfVar14;
  uint uVar15;
  undefined1 (*pauVar16) [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar31;
  undefined1 auVar33 [28];
  undefined1 auVar32 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar41 [32];
  float fVar49;
  undefined1 auVar50 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  float fVar73;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar74 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar75 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar40 [32];
  
  iVar3 = top_blob->w;
  if (0 < (long)iVar3) {
    pvVar4 = bias_data->data;
    uVar13 = bottom_blob->elempack * bottom_blob->w;
    lVar9 = 0;
    auVar19._8_4_ = 0x3f000000;
    auVar19._0_8_ = 0x3f0000003f000000;
    auVar19._12_4_ = 0x3f000000;
    auVar19._16_4_ = 0x3f000000;
    auVar19._20_4_ = 0x3f000000;
    auVar19._24_4_ = 0x3f000000;
    auVar19._28_4_ = 0x3f000000;
    auVar72 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar67._8_4_ = 0x3f800000;
    auVar67._0_8_ = 0x3f8000003f800000;
    auVar67._12_4_ = 0x3f800000;
    do {
      fVar103 = 0.0;
      fVar104 = 0.0;
      fVar101 = 0.0;
      fVar102 = 0.0;
      fVar105 = 0.0;
      fVar106 = 0.0;
      fVar107 = 0.0;
      fVar108 = 0.0;
      if (pvVar4 != (void *)0x0) {
        pfVar14 = (float *)((long)pvVar4 + lVar9 * 0x20);
        fVar101 = *pfVar14;
        fVar102 = pfVar14[1];
        fVar103 = pfVar14[2];
        fVar104 = pfVar14[3];
        fVar105 = pfVar14[4];
        fVar106 = pfVar14[5];
        fVar107 = pfVar14[6];
        fVar108 = pfVar14[7];
      }
      pauVar16 = (undefined1 (*) [32])
                 (weight_data_fp16->w * lVar9 * weight_data_fp16->elemsize +
                 (long)weight_data_fp16->data);
      pfVar14 = (float *)bottom_blob->data;
      if ((int)uVar13 < 8) {
        fVar109 = 0.0;
        fVar110 = 0.0;
        fVar111 = 0.0;
        fVar112 = 0.0;
        fVar113 = 0.0;
        fVar114 = 0.0;
        fVar115 = 0.0;
        fVar116 = 0.0;
        fVar91 = 0.0;
        fVar92 = 0.0;
        fVar93 = 0.0;
        fVar94 = 0.0;
        fVar95 = 0.0;
        fVar96 = 0.0;
        fVar97 = 0.0;
        fVar98 = 0.0;
        fVar49 = 0.0;
        fVar60 = 0.0;
        fVar61 = 0.0;
        fVar62 = 0.0;
        fVar63 = 0.0;
        fVar64 = 0.0;
        fVar65 = 0.0;
        fVar66 = 0.0;
        fVar83 = 0.0;
        fVar84 = 0.0;
        fVar85 = 0.0;
        fVar86 = 0.0;
        fVar87 = 0.0;
        fVar88 = 0.0;
        fVar89 = 0.0;
        fVar90 = 0.0;
        fVar20 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar73 = 0.0;
        fVar76 = 0.0;
        fVar77 = 0.0;
        fVar78 = 0.0;
        fVar79 = 0.0;
        fVar80 = 0.0;
        fVar81 = 0.0;
        fVar82 = 0.0;
        uVar11 = 0;
      }
      else {
        fVar73 = 0.0;
        fVar76 = 0.0;
        fVar77 = 0.0;
        fVar78 = 0.0;
        fVar79 = 0.0;
        fVar80 = 0.0;
        fVar81 = 0.0;
        fVar82 = 0.0;
        iVar10 = 7;
        fVar31 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar20 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar83 = 0.0;
        fVar84 = 0.0;
        fVar85 = 0.0;
        fVar86 = 0.0;
        fVar87 = 0.0;
        fVar88 = 0.0;
        fVar89 = 0.0;
        fVar90 = 0.0;
        fVar49 = 0.0;
        fVar60 = 0.0;
        fVar61 = 0.0;
        fVar62 = 0.0;
        fVar63 = 0.0;
        fVar64 = 0.0;
        fVar65 = 0.0;
        fVar66 = 0.0;
        fVar91 = 0.0;
        fVar92 = 0.0;
        fVar93 = 0.0;
        fVar94 = 0.0;
        fVar95 = 0.0;
        fVar96 = 0.0;
        fVar97 = 0.0;
        fVar98 = 0.0;
        fVar109 = 0.0;
        fVar110 = 0.0;
        fVar111 = 0.0;
        fVar112 = 0.0;
        fVar113 = 0.0;
        fVar114 = 0.0;
        fVar115 = 0.0;
        fVar116 = 0.0;
        do {
          auVar21 = vlddqu_avx(*pauVar16);
          fVar1 = *pfVar14;
          auVar69 = vcvtph2ps_f16c(auVar21._0_16_);
          fVar101 = fVar1 * auVar69._0_4_ + fVar101;
          fVar102 = fVar1 * auVar69._4_4_ + fVar102;
          fVar103 = fVar1 * auVar69._8_4_ + fVar103;
          fVar104 = fVar1 * auVar69._12_4_ + fVar104;
          fVar105 = fVar1 * auVar69._16_4_ + fVar105;
          fVar106 = fVar1 * auVar69._20_4_ + fVar106;
          fVar107 = fVar1 * auVar69._24_4_ + fVar107;
          fVar108 = fVar1 + fVar108;
          fVar1 = pfVar14[1];
          auVar21 = vcvtph2ps_f16c(auVar21._16_16_);
          fVar73 = fVar1 * auVar21._0_4_ + fVar73;
          fVar76 = fVar1 * auVar21._4_4_ + fVar76;
          fVar77 = fVar1 * auVar21._8_4_ + fVar77;
          fVar78 = fVar1 * auVar21._12_4_ + fVar78;
          fVar79 = fVar1 * auVar21._16_4_ + fVar79;
          fVar80 = fVar1 * auVar21._20_4_ + fVar80;
          fVar81 = fVar1 * auVar21._24_4_ + fVar81;
          fVar82 = auVar21._28_4_ + fVar82;
          auVar21 = vlddqu_avx(pauVar16[1]);
          fVar1 = pfVar14[2];
          auVar69 = vcvtph2ps_f16c(auVar21._0_16_);
          fVar31 = fVar1 * auVar69._0_4_ + fVar31;
          fVar42 = fVar1 * auVar69._4_4_ + fVar42;
          fVar43 = fVar1 * auVar69._8_4_ + fVar43;
          fVar44 = fVar1 * auVar69._12_4_ + fVar44;
          fVar45 = fVar1 * auVar69._16_4_ + fVar45;
          fVar46 = fVar1 * auVar69._20_4_ + fVar46;
          fVar47 = fVar1 * auVar69._24_4_ + fVar47;
          fVar48 = fVar1 + fVar48;
          fVar1 = pfVar14[3];
          auVar21 = vcvtph2ps_f16c(auVar21._16_16_);
          fVar20 = fVar1 * auVar21._0_4_ + fVar20;
          fVar24 = fVar1 * auVar21._4_4_ + fVar24;
          fVar25 = fVar1 * auVar21._8_4_ + fVar25;
          fVar26 = fVar1 * auVar21._12_4_ + fVar26;
          fVar27 = fVar1 * auVar21._16_4_ + fVar27;
          fVar28 = fVar1 * auVar21._20_4_ + fVar28;
          fVar29 = fVar1 * auVar21._24_4_ + fVar29;
          fVar30 = auVar21._28_4_ + fVar30;
          auVar21 = vlddqu_avx(pauVar16[2]);
          fVar1 = pfVar14[4];
          auVar69 = vcvtph2ps_f16c(auVar21._0_16_);
          fVar83 = fVar1 * auVar69._0_4_ + fVar83;
          fVar84 = fVar1 * auVar69._4_4_ + fVar84;
          fVar85 = fVar1 * auVar69._8_4_ + fVar85;
          fVar86 = fVar1 * auVar69._12_4_ + fVar86;
          fVar87 = fVar1 * auVar69._16_4_ + fVar87;
          fVar88 = fVar1 * auVar69._20_4_ + fVar88;
          fVar89 = fVar1 * auVar69._24_4_ + fVar89;
          fVar90 = fVar1 + fVar90;
          fVar1 = pfVar14[5];
          auVar21 = vcvtph2ps_f16c(auVar21._16_16_);
          fVar49 = fVar1 * auVar21._0_4_ + fVar49;
          fVar60 = fVar1 * auVar21._4_4_ + fVar60;
          fVar61 = fVar1 * auVar21._8_4_ + fVar61;
          fVar62 = fVar1 * auVar21._12_4_ + fVar62;
          fVar63 = fVar1 * auVar21._16_4_ + fVar63;
          fVar64 = fVar1 * auVar21._20_4_ + fVar64;
          fVar65 = fVar1 * auVar21._24_4_ + fVar65;
          fVar66 = auVar21._28_4_ + fVar66;
          auVar21 = vlddqu_avx(pauVar16[3]);
          fVar1 = pfVar14[6];
          auVar69 = vcvtph2ps_f16c(auVar21._0_16_);
          fVar91 = fVar1 * auVar69._0_4_ + fVar91;
          fVar92 = fVar1 * auVar69._4_4_ + fVar92;
          fVar93 = fVar1 * auVar69._8_4_ + fVar93;
          fVar94 = fVar1 * auVar69._12_4_ + fVar94;
          fVar95 = fVar1 * auVar69._16_4_ + fVar95;
          fVar96 = fVar1 * auVar69._20_4_ + fVar96;
          fVar97 = fVar1 * auVar69._24_4_ + fVar97;
          fVar98 = fVar1 + fVar98;
          fVar1 = pfVar14[7];
          auVar21 = vcvtph2ps_f16c(auVar21._16_16_);
          fVar109 = fVar1 * auVar21._0_4_ + fVar109;
          fVar110 = fVar1 * auVar21._4_4_ + fVar110;
          fVar111 = fVar1 * auVar21._8_4_ + fVar111;
          fVar112 = fVar1 * auVar21._12_4_ + fVar112;
          fVar113 = fVar1 * auVar21._16_4_ + fVar113;
          fVar114 = fVar1 * auVar21._20_4_ + fVar114;
          fVar115 = fVar1 * auVar21._24_4_ + fVar115;
          fVar116 = auVar21._28_4_ + fVar116;
          pfVar14 = pfVar14 + 8;
          pauVar16 = pauVar16 + 4;
          iVar10 = iVar10 + 8;
          uVar11 = uVar13 & 0xfffffff8;
        } while (iVar10 < (int)uVar13);
      }
      uVar15 = uVar11 | 3;
      while ((int)uVar15 < (int)uVar13) {
        auVar21 = vlddqu_avx(*pauVar16);
        fVar1 = *pfVar14;
        auVar69 = vcvtph2ps_f16c(auVar21._0_16_);
        fVar101 = fVar1 * auVar69._0_4_ + fVar101;
        fVar102 = fVar1 * auVar69._4_4_ + fVar102;
        fVar103 = fVar1 * auVar69._8_4_ + fVar103;
        fVar104 = fVar1 * auVar69._12_4_ + fVar104;
        fVar105 = fVar1 * auVar69._16_4_ + fVar105;
        fVar106 = fVar1 * auVar69._20_4_ + fVar106;
        fVar107 = fVar1 * auVar69._24_4_ + fVar107;
        fVar108 = fVar1 + fVar108;
        fVar1 = pfVar14[1];
        auVar21 = vcvtph2ps_f16c(auVar21._16_16_);
        fVar73 = fVar1 * auVar21._0_4_ + fVar73;
        fVar76 = fVar1 * auVar21._4_4_ + fVar76;
        fVar77 = fVar1 * auVar21._8_4_ + fVar77;
        fVar78 = fVar1 * auVar21._12_4_ + fVar78;
        fVar79 = fVar1 * auVar21._16_4_ + fVar79;
        fVar80 = fVar1 * auVar21._20_4_ + fVar80;
        fVar81 = fVar1 * auVar21._24_4_ + fVar81;
        fVar82 = auVar21._28_4_ + fVar82;
        auVar21 = vlddqu_avx(pauVar16[1]);
        fVar1 = pfVar14[2];
        auVar69 = vcvtph2ps_f16c(auVar21._0_16_);
        fVar31 = fVar1 * auVar69._0_4_ + fVar31;
        fVar42 = fVar1 * auVar69._4_4_ + fVar42;
        fVar43 = fVar1 * auVar69._8_4_ + fVar43;
        fVar44 = fVar1 * auVar69._12_4_ + fVar44;
        fVar45 = fVar1 * auVar69._16_4_ + fVar45;
        fVar46 = fVar1 * auVar69._20_4_ + fVar46;
        fVar47 = fVar1 * auVar69._24_4_ + fVar47;
        fVar48 = fVar1 + fVar48;
        fVar1 = pfVar14[3];
        auVar21 = vcvtph2ps_f16c(auVar21._16_16_);
        fVar20 = fVar1 * auVar21._0_4_ + fVar20;
        fVar24 = fVar1 * auVar21._4_4_ + fVar24;
        fVar25 = fVar1 * auVar21._8_4_ + fVar25;
        fVar26 = fVar1 * auVar21._12_4_ + fVar26;
        fVar27 = fVar1 * auVar21._16_4_ + fVar27;
        fVar28 = fVar1 * auVar21._20_4_ + fVar28;
        fVar29 = fVar1 * auVar21._24_4_ + fVar29;
        fVar30 = auVar21._28_4_ + fVar30;
        pfVar14 = pfVar14 + 4;
        pauVar16 = pauVar16 + 2;
        uVar15 = uVar11 + 7;
        uVar11 = uVar11 + 4;
      }
      if (uVar13 - uVar11 != 0 && (int)uVar11 <= (int)uVar13) {
        lVar12 = 0;
        do {
          fVar1 = pfVar14[lVar12];
          auVar50 = vlddqu_avx(*(undefined1 (*) [16])*pauVar16);
          auVar21 = vcvtph2ps_f16c(auVar50);
          fVar101 = fVar1 * auVar21._0_4_ + fVar101;
          fVar102 = fVar1 * auVar21._4_4_ + fVar102;
          fVar103 = fVar1 * auVar21._8_4_ + fVar103;
          fVar104 = fVar1 * auVar21._12_4_ + fVar104;
          fVar105 = fVar1 * auVar21._16_4_ + fVar105;
          fVar106 = fVar1 * auVar21._20_4_ + fVar106;
          fVar107 = fVar1 * auVar21._24_4_ + fVar107;
          fVar108 = fVar1 + fVar108;
          pauVar16 = (undefined1 (*) [32])(*pauVar16 + 0x10);
          lVar12 = lVar12 + 1;
        } while (uVar13 - uVar11 != (int)lVar12);
      }
      fVar66 = fVar98 + fVar116 + fVar90 + fVar66;
      fVar101 = fVar101 + fVar91 + fVar109 + fVar83 + fVar49 + fVar20 + fVar31 + fVar73;
      fVar102 = fVar102 + fVar92 + fVar110 + fVar84 + fVar60 + fVar24 + fVar42 + fVar76;
      auVar21._0_8_ = CONCAT44(fVar102,fVar101);
      auVar21._8_4_ = fVar103 + fVar93 + fVar111 + fVar85 + fVar61 + fVar25 + fVar43 + fVar77;
      auVar21._12_4_ = fVar104 + fVar94 + fVar112 + fVar86 + fVar62 + fVar26 + fVar44 + fVar78;
      auVar21._16_4_ = fVar105 + fVar95 + fVar113 + fVar87 + fVar63 + fVar27 + fVar45 + fVar79;
      auVar21._20_4_ = fVar106 + fVar96 + fVar114 + fVar88 + fVar64 + fVar28 + fVar46 + fVar80;
      auVar21._24_4_ = fVar107 + fVar97 + fVar115 + fVar89 + fVar65 + fVar29 + fVar47 + fVar81;
      auVar21._28_4_ = fVar108 + fVar66 + fVar30 + fVar48 + fVar82;
      auVar69 = auVar72._0_32_;
      fVar103 = auVar72._0_4_;
      fVar104 = auVar72._4_4_;
      fVar105 = auVar72._8_4_;
      fVar106 = auVar72._12_4_;
      fVar107 = auVar72._16_4_;
      fVar108 = auVar72._20_4_;
      fVar20 = auVar72._24_4_;
      fVar24 = auVar72._28_4_;
      switch(activation_type) {
      case 1:
        auVar21 = vmaxps_avx(auVar21,_DAT_00519320);
        break;
      case 2:
        auVar69 = vmaxps_avx(auVar21,ZEXT1632(ZEXT816(0) << 0x40));
        auVar41 = vminps_avx(auVar21,ZEXT1632(ZEXT816(0) << 0x40));
        fVar101 = *activation_params->data;
        auVar21._0_4_ = fVar101 * auVar41._0_4_ + auVar69._0_4_;
        auVar21._4_4_ = fVar101 * auVar41._4_4_ + auVar69._4_4_;
        auVar21._8_4_ = fVar101 * auVar41._8_4_ + auVar69._8_4_;
        auVar21._12_4_ = fVar101 * auVar41._12_4_ + auVar69._12_4_;
        auVar21._16_4_ = fVar101 * auVar41._16_4_ + auVar69._16_4_;
        auVar21._20_4_ = fVar101 * auVar41._20_4_ + auVar69._20_4_;
        auVar21._24_4_ = fVar101 * auVar41._24_4_ + auVar69._24_4_;
        auVar21._28_4_ = auVar41._28_4_ + auVar69._28_4_;
        break;
      case 3:
        uVar2 = *activation_params->data;
        auVar36._4_4_ = uVar2;
        auVar36._0_4_ = uVar2;
        auVar36._8_4_ = uVar2;
        auVar36._12_4_ = uVar2;
        auVar36._16_4_ = uVar2;
        auVar36._20_4_ = uVar2;
        auVar36._24_4_ = uVar2;
        auVar36._28_4_ = uVar2;
        uVar2 = *(undefined4 *)((long)activation_params->data + 4);
        auVar59._4_4_ = uVar2;
        auVar59._0_4_ = uVar2;
        auVar59._8_4_ = uVar2;
        auVar59._12_4_ = uVar2;
        auVar59._16_4_ = uVar2;
        auVar59._20_4_ = uVar2;
        auVar59._24_4_ = uVar2;
        auVar59._28_4_ = uVar2;
        auVar21 = vmaxps_avx(auVar21,auVar36);
        auVar21 = vminps_avx(auVar21,auVar59);
        break;
      case 4:
        auVar22._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
        auVar22._8_4_ = -auVar21._8_4_;
        auVar22._12_4_ = -auVar21._12_4_;
        auVar22._16_4_ = -auVar21._16_4_;
        auVar22._20_4_ = -auVar21._20_4_;
        auVar22._24_4_ = -auVar21._24_4_;
        auVar22._28_4_ = -auVar21._28_4_;
        auVar37._8_4_ = 0x42b0c0a5;
        auVar37._0_8_ = 0x42b0c0a542b0c0a5;
        auVar37._12_4_ = 0x42b0c0a5;
        auVar37._16_4_ = 0x42b0c0a5;
        auVar37._20_4_ = 0x42b0c0a5;
        auVar37._24_4_ = 0x42b0c0a5;
        auVar37._28_4_ = 0x42b0c0a5;
        auVar21 = vminps_avx(auVar22,auVar37);
        auVar38._8_4_ = 0xc2b0c0a5;
        auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar38._12_4_ = 0xc2b0c0a5;
        auVar38._16_4_ = 0xc2b0c0a5;
        auVar38._20_4_ = 0xc2b0c0a5;
        auVar38._24_4_ = 0xc2b0c0a5;
        auVar38._28_4_ = 0xc2b0c0a5;
        auVar41 = vmaxps_avx(auVar21,auVar38);
        auVar39._0_4_ = auVar41._0_4_ * 1.442695 + 0.5;
        auVar39._4_4_ = auVar41._4_4_ * 1.442695 + 0.5;
        auVar39._8_4_ = auVar41._8_4_ * 1.442695 + 0.5;
        auVar39._12_4_ = auVar41._12_4_ * 1.442695 + 0.5;
        auVar39._16_4_ = auVar41._16_4_ * 1.442695 + 0.5;
        auVar39._20_4_ = auVar41._20_4_ * 1.442695 + 0.5;
        auVar39._24_4_ = auVar41._24_4_ * 1.442695 + 0.5;
        auVar39._28_4_ = 0x3ff8aa3b;
        auVar18 = vroundps_avx(auVar39,1);
        auVar21 = vcmpps_avx(auVar39,auVar18,1);
        auVar21 = vandps_avx(auVar21,auVar69);
        auVar21 = vsubps_avx(auVar18,auVar21);
        fVar101 = auVar41._0_4_ + auVar21._0_4_ * -0.6931472;
        fVar102 = auVar41._4_4_ + auVar21._4_4_ * -0.6931472;
        fVar25 = auVar41._8_4_ + auVar21._8_4_ * -0.6931472;
        fVar26 = auVar41._12_4_ + auVar21._12_4_ * -0.6931472;
        fVar27 = auVar41._16_4_ + auVar21._16_4_ * -0.6931472;
        fVar28 = auVar41._20_4_ + auVar21._20_4_ * -0.6931472;
        fVar29 = auVar41._24_4_ + auVar21._24_4_ * -0.6931472;
        auVar32._0_4_ = (int)auVar21._0_4_;
        auVar32._4_4_ = (int)auVar21._4_4_;
        auVar32._8_4_ = (int)auVar21._8_4_;
        auVar32._12_4_ = (int)auVar21._12_4_;
        auVar40._16_4_ = (int)auVar21._16_4_;
        auVar40._0_16_ = auVar32;
        auVar40._20_4_ = (int)auVar21._20_4_;
        auVar40._24_4_ = (int)auVar21._24_4_;
        auVar40._28_4_ = (int)auVar21._28_4_;
        auVar74 = vpslld_avx(auVar32,0x17);
        auVar50 = vpslld_avx(auVar40._16_16_,0x17);
        auVar17._8_4_ = 0x3f800000;
        auVar17._0_8_ = 0x3f8000003f800000;
        auVar17._12_4_ = 0x3f800000;
        auVar50 = vpaddd_avx(auVar50,auVar17);
        auVar74 = vpaddd_avx(auVar74,auVar17);
        auVar23._0_4_ =
             (fVar101 + fVar103 +
             fVar101 * fVar101 *
             (((((fVar101 * 0.00019875691 + 0.0013981999) * fVar101 + 0.008333452) * fVar101 +
               0.041665796) * fVar101 + 0.16666666) * fVar101 + 0.5)) * auVar74._0_4_ + fVar103;
        auVar23._4_4_ =
             (fVar102 + fVar104 +
             fVar102 * fVar102 *
             (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102 +
               0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5)) * auVar74._4_4_ + fVar104;
        auVar23._8_4_ =
             (fVar25 + fVar105 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar74._8_4_ + fVar105;
        auVar23._12_4_ =
             (fVar26 + fVar106 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar74._12_4_ + fVar106;
        auVar23._16_4_ =
             (fVar27 + fVar107 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar50._0_4_ + fVar107;
        auVar23._20_4_ =
             (fVar28 + fVar108 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar50._4_4_ + fVar108;
        auVar23._24_4_ =
             (fVar29 + fVar20 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar50._8_4_ + fVar20;
        auVar23._28_4_ = auVar41._28_4_ + -0.6931472 + fVar24 + -0.6931472 + fVar24;
        auVar41 = vrcpps_avx(auVar23);
        fVar101 = auVar41._0_4_;
        fVar102 = auVar41._4_4_;
        auVar8._4_4_ = auVar23._4_4_ * fVar102;
        auVar8._0_4_ = auVar23._0_4_ * fVar101;
        fVar103 = auVar41._8_4_;
        auVar8._8_4_ = auVar23._8_4_ * fVar103;
        fVar104 = auVar41._12_4_;
        auVar8._12_4_ = auVar23._12_4_ * fVar104;
        fVar105 = auVar41._16_4_;
        auVar8._16_4_ = auVar23._16_4_ * fVar105;
        fVar106 = auVar41._20_4_;
        auVar8._20_4_ = auVar23._20_4_ * fVar106;
        fVar107 = auVar41._24_4_;
        auVar8._24_4_ = auVar23._24_4_ * fVar107;
        auVar8._28_4_ = auVar23._28_4_;
        auVar69 = vsubps_avx(auVar69,auVar8);
        auVar21._0_4_ = fVar101 + fVar101 * auVar69._0_4_;
        auVar21._4_4_ = fVar102 + fVar102 * auVar69._4_4_;
        auVar21._8_4_ = fVar103 + fVar103 * auVar69._8_4_;
        auVar21._12_4_ = fVar104 + fVar104 * auVar69._12_4_;
        auVar21._16_4_ = fVar105 + fVar105 * auVar69._16_4_;
        auVar21._20_4_ = fVar106 + fVar106 * auVar69._20_4_;
        auVar21._24_4_ = fVar107 + fVar107 * auVar69._24_4_;
        auVar21._28_4_ = auVar41._28_4_ + auVar69._28_4_;
        break;
      case 5:
        auVar99._8_4_ = 0x42b0c0a5;
        auVar99._0_8_ = 0x42b0c0a542b0c0a5;
        auVar99._12_4_ = 0x42b0c0a5;
        auVar99._16_4_ = 0x42b0c0a5;
        auVar99._20_4_ = 0x42b0c0a5;
        auVar99._24_4_ = 0x42b0c0a5;
        auVar99._28_4_ = 0x42b0c0a5;
        auVar41 = vminps_avx(auVar99,auVar21);
        auVar100._8_4_ = 0xc2b0c0a5;
        auVar100._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar100._12_4_ = 0xc2b0c0a5;
        auVar100._16_4_ = 0xc2b0c0a5;
        auVar100._20_4_ = 0xc2b0c0a5;
        auVar100._24_4_ = 0xc2b0c0a5;
        auVar100._28_4_ = 0xc2b0c0a5;
        auVar18 = vmaxps_avx(auVar100,auVar41);
        auVar51._0_4_ = auVar18._0_4_ * 1.442695 + 0.5;
        auVar51._4_4_ = auVar18._4_4_ * 1.442695 + 0.5;
        auVar51._8_4_ = auVar18._8_4_ * 1.442695 + 0.5;
        auVar51._12_4_ = auVar18._12_4_ * 1.442695 + 0.5;
        auVar51._16_4_ = auVar18._16_4_ * 1.442695 + 0.5;
        auVar51._20_4_ = auVar18._20_4_ * 1.442695 + 0.5;
        auVar51._24_4_ = auVar18._24_4_ * 1.442695 + 0.5;
        auVar51._28_4_ = fVar66 + 0.5;
        auVar53 = vroundps_avx(auVar51,1);
        auVar41 = vcmpps_avx(auVar51,auVar53,1);
        auVar41 = vandps_avx(auVar41,auVar69);
        auVar41 = vsubps_avx(auVar53,auVar41);
        auVar5._4_4_ = auVar41._4_4_ * 0.6931472;
        auVar5._0_4_ = auVar41._0_4_ * 0.6931472;
        auVar5._8_4_ = auVar41._8_4_ * 0.6931472;
        auVar5._12_4_ = auVar41._12_4_ * 0.6931472;
        auVar5._16_4_ = auVar41._16_4_ * 0.6931472;
        auVar5._20_4_ = auVar41._20_4_ * 0.6931472;
        auVar5._24_4_ = auVar41._24_4_ * 0.6931472;
        auVar5._28_4_ = auVar53._28_4_;
        auVar18 = vsubps_avx(auVar18,auVar5);
        fVar25 = auVar18._0_4_;
        fVar26 = auVar18._4_4_;
        fVar27 = auVar18._8_4_;
        fVar28 = auVar18._12_4_;
        fVar29 = auVar18._16_4_;
        fVar30 = auVar18._20_4_;
        fVar31 = auVar18._24_4_;
        auVar50._0_4_ = (int)auVar41._0_4_;
        auVar50._4_4_ = (int)auVar41._4_4_;
        auVar50._8_4_ = (int)auVar41._8_4_;
        auVar50._12_4_ = (int)auVar41._12_4_;
        auVar52._16_4_ = (int)auVar41._16_4_;
        auVar52._0_16_ = auVar50;
        auVar52._20_4_ = (int)auVar41._20_4_;
        auVar52._24_4_ = (int)auVar41._24_4_;
        auVar52._28_4_ = (int)auVar41._28_4_;
        auVar74 = vpslld_avx(auVar50,0x17);
        auVar50 = vpslld_avx(auVar52._16_16_,0x17);
        auVar50 = vpaddd_avx(auVar50,auVar67);
        auVar74 = vpaddd_avx(auVar74,auVar67);
        auVar34._0_4_ =
             (fVar25 + fVar103 +
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * fVar25 * fVar25) *
             auVar74._0_4_ + fVar103;
        auVar34._4_4_ =
             (fVar26 + fVar104 +
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26) *
             auVar74._4_4_ + fVar104;
        auVar34._8_4_ =
             (fVar27 + fVar105 +
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27) *
             auVar74._8_4_ + fVar105;
        auVar34._12_4_ =
             (fVar28 + fVar106 +
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5) * fVar28 * fVar28) *
             auVar74._12_4_ + fVar106;
        auVar34._16_4_ =
             (fVar29 + fVar107 +
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29) *
             auVar50._0_4_ + fVar107;
        auVar34._20_4_ =
             (fVar30 + fVar108 +
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30) *
             auVar50._4_4_ + fVar108;
        auVar34._24_4_ =
             (fVar31 + fVar20 +
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31) *
             auVar50._8_4_ + fVar20;
        auVar34._28_4_ = auVar18._28_4_ + fVar24 + auVar53._28_4_ + fVar24;
        auVar53._8_4_ = 0x800000;
        auVar53._0_8_ = 0x80000000800000;
        auVar53._12_4_ = 0x800000;
        auVar53._16_4_ = 0x800000;
        auVar53._20_4_ = 0x800000;
        auVar53._24_4_ = 0x800000;
        auVar53._28_4_ = 0x800000;
        auVar53 = vmaxps_avx(auVar34,auVar53);
        auVar50 = vpsrld_avx(auVar53._16_16_,0x17);
        auVar54._8_4_ = 0x807fffff;
        auVar54._0_8_ = 0x807fffff807fffff;
        auVar54._12_4_ = 0x807fffff;
        auVar54._16_4_ = 0x807fffff;
        auVar54._20_4_ = 0x807fffff;
        auVar54._24_4_ = 0x807fffff;
        auVar54._28_4_ = 0x807fffff;
        auVar41 = vandps_avx(auVar53,auVar54);
        auVar5 = vorps_avx(auVar41,auVar19);
        auVar70._8_4_ = 0x3f3504f3;
        auVar70._0_8_ = 0x3f3504f33f3504f3;
        auVar70._12_4_ = 0x3f3504f3;
        auVar70._16_4_ = 0x3f3504f3;
        auVar70._20_4_ = 0x3f3504f3;
        auVar70._24_4_ = 0x3f3504f3;
        auVar70._28_4_ = 0x3f3504f3;
        auVar18 = vcmpps_avx(auVar70,auVar5,2);
        auVar41 = vandnps_avx(auVar18,auVar5);
        fVar25 = auVar41._0_4_ + auVar5._0_4_ + -1.0;
        fVar26 = auVar41._4_4_ + auVar5._4_4_ + -1.0;
        fVar27 = auVar41._8_4_ + auVar5._8_4_ + -1.0;
        fVar28 = auVar41._12_4_ + auVar5._12_4_ + -1.0;
        fVar29 = auVar41._16_4_ + auVar5._16_4_ + -1.0;
        fVar30 = auVar41._20_4_ + auVar5._20_4_ + -1.0;
        fVar31 = auVar41._24_4_ + auVar5._24_4_ + -1.0;
        auVar50 = vpsubd_avx(auVar50,auVar18._16_16_);
        auVar74 = vpsrld_avx(auVar53._0_16_,0x17);
        auVar68._8_4_ = 0xffffff81;
        auVar68._0_8_ = 0xffffff81ffffff81;
        auVar68._12_4_ = 0xffffff81;
        auVar50 = vpaddd_avx(auVar50,auVar68);
        auVar74 = vpsubd_avx(auVar74,auVar18._0_16_);
        auVar74 = vpaddd_avx(auVar74,auVar68);
        auVar75._16_16_ = auVar50;
        auVar75._0_16_ = auVar74;
        auVar18 = vcmpps_avx(auVar34,_DAT_00519320,2);
        auVar53 = vcvtdq2ps_avx(auVar75);
        auVar6._4_4_ = (fVar26 * fVar26 *
                        (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26
                              + -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26
                           + 0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 +
                        -0.5) + auVar53._4_4_ * 0.6931472 + fVar26) * -2.0;
        auVar6._0_4_ = (fVar25 * fVar25 *
                        (((((((((fVar25 * 0.070376836 + -0.1151461) * fVar25 + 0.116769984) * fVar25
                              + -0.12420141) * fVar25 + 0.14249323) * fVar25 + -0.16668057) * fVar25
                           + 0.20000714) * fVar25 + -0.24999994) * fVar25 + 0.3333333) * fVar25 +
                        -0.5) + auVar53._0_4_ * 0.6931472 + fVar25) * -2.0;
        auVar6._8_4_ = (fVar27 * fVar27 *
                        (((((((((fVar27 * 0.070376836 + -0.1151461) * fVar27 + 0.116769984) * fVar27
                              + -0.12420141) * fVar27 + 0.14249323) * fVar27 + -0.16668057) * fVar27
                           + 0.20000714) * fVar27 + -0.24999994) * fVar27 + 0.3333333) * fVar27 +
                        -0.5) + auVar53._8_4_ * 0.6931472 + fVar27) * -2.0;
        auVar6._12_4_ =
             (fVar28 * fVar28 *
              (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                    -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                 0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5) +
             auVar53._12_4_ * 0.6931472 + fVar28) * -2.0;
        auVar6._16_4_ =
             (fVar29 * fVar29 *
              (((((((((fVar29 * 0.070376836 + -0.1151461) * fVar29 + 0.116769984) * fVar29 +
                    -0.12420141) * fVar29 + 0.14249323) * fVar29 + -0.16668057) * fVar29 +
                 0.20000714) * fVar29 + -0.24999994) * fVar29 + 0.3333333) * fVar29 + -0.5) +
             auVar53._16_4_ * 0.6931472 + fVar29) * -2.0;
        auVar6._20_4_ =
             (fVar30 * fVar30 *
              (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                    -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 +
                 0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5) +
             auVar53._20_4_ * 0.6931472 + fVar30) * -2.0;
        auVar6._24_4_ =
             (fVar31 * fVar31 *
              (((((((((fVar31 * 0.070376836 + -0.1151461) * fVar31 + 0.116769984) * fVar31 +
                    -0.12420141) * fVar31 + 0.14249323) * fVar31 + -0.16668057) * fVar31 +
                 0.20000714) * fVar31 + -0.24999994) * fVar31 + 0.3333333) * fVar31 + -0.5) +
             auVar53._24_4_ * 0.6931472 + fVar31) * -2.0;
        auVar6._28_4_ = auVar53._28_4_ + auVar41._28_4_ + auVar5._28_4_ + -1.0 + 0.0;
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar71._16_4_ = 0x7fffffff;
        auVar71._20_4_ = 0x7fffffff;
        auVar71._24_4_ = 0x7fffffff;
        auVar71._28_4_ = 0x7fffffff;
        auVar41 = vblendvps_avx(auVar6,auVar71,auVar18);
        auVar55._8_4_ = 0x42b0c0a5;
        auVar55._0_8_ = 0x42b0c0a542b0c0a5;
        auVar55._12_4_ = 0x42b0c0a5;
        auVar55._16_4_ = 0x42b0c0a5;
        auVar55._20_4_ = 0x42b0c0a5;
        auVar55._24_4_ = 0x42b0c0a5;
        auVar55._28_4_ = 0x42b0c0a5;
        auVar41 = vminps_avx(auVar41,auVar55);
        auVar56._8_4_ = 0xc2b0c0a5;
        auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar56._12_4_ = 0xc2b0c0a5;
        auVar56._16_4_ = 0xc2b0c0a5;
        auVar56._20_4_ = 0xc2b0c0a5;
        auVar56._24_4_ = 0xc2b0c0a5;
        auVar56._28_4_ = 0xc2b0c0a5;
        auVar18 = vmaxps_avx(auVar41,auVar56);
        auVar57._0_4_ = auVar18._0_4_ * 1.442695 + 0.5;
        auVar57._4_4_ = auVar18._4_4_ * 1.442695 + 0.5;
        auVar57._8_4_ = auVar18._8_4_ * 1.442695 + 0.5;
        auVar57._12_4_ = auVar18._12_4_ * 1.442695 + 0.5;
        auVar57._16_4_ = auVar18._16_4_ * 1.442695 + 0.5;
        auVar57._20_4_ = auVar18._20_4_ * 1.442695 + 0.5;
        auVar57._24_4_ = auVar18._24_4_ * 1.442695 + 0.5;
        auVar57._28_4_ = 0x3ff8aa3b;
        auVar53 = vroundps_avx(auVar57,1);
        auVar41 = vcmpps_avx(auVar57,auVar53,1);
        auVar41 = vandps_avx(auVar41,auVar69);
        auVar41 = vsubps_avx(auVar53,auVar41);
        auVar7._4_4_ = auVar41._4_4_ * 0.6931472;
        auVar7._0_4_ = auVar41._0_4_ * 0.6931472;
        auVar7._8_4_ = auVar41._8_4_ * 0.6931472;
        auVar7._12_4_ = auVar41._12_4_ * 0.6931472;
        auVar7._16_4_ = auVar41._16_4_ * 0.6931472;
        auVar7._20_4_ = auVar41._20_4_ * 0.6931472;
        auVar7._24_4_ = auVar41._24_4_ * 0.6931472;
        auVar7._28_4_ = auVar53._28_4_;
        auVar18 = vsubps_avx(auVar18,auVar7);
        fVar25 = auVar18._0_4_;
        fVar26 = auVar18._4_4_;
        fVar27 = auVar18._8_4_;
        fVar28 = auVar18._12_4_;
        fVar29 = auVar18._16_4_;
        fVar30 = auVar18._20_4_;
        fVar31 = auVar18._24_4_;
        auVar72 = ZEXT3264(auVar69);
        auVar74._0_4_ = (int)auVar41._0_4_;
        auVar74._4_4_ = (int)auVar41._4_4_;
        auVar74._8_4_ = (int)auVar41._8_4_;
        auVar74._12_4_ = (int)auVar41._12_4_;
        auVar58._16_4_ = (int)auVar41._16_4_;
        auVar58._0_16_ = auVar74;
        auVar58._20_4_ = (int)auVar41._20_4_;
        auVar58._24_4_ = (int)auVar41._24_4_;
        auVar58._28_4_ = (int)auVar41._28_4_;
        auVar74 = vpslld_avx(auVar74,0x17);
        auVar50 = vpslld_avx(auVar58._16_16_,0x17);
        auVar50 = vpaddd_avx(auVar50,auVar67);
        auVar74 = vpaddd_avx(auVar74,auVar67);
        auVar35._0_4_ =
             (fVar25 + fVar103 +
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * fVar25 * fVar25) *
             auVar74._0_4_ + fVar103;
        auVar35._4_4_ =
             (fVar26 + fVar104 +
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5) * fVar26 * fVar26) *
             auVar74._4_4_ + fVar104;
        auVar35._8_4_ =
             (fVar27 + fVar105 +
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27) *
             auVar74._8_4_ + fVar105;
        auVar35._12_4_ =
             (fVar28 + fVar106 +
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5) * fVar28 * fVar28) *
             auVar74._12_4_ + fVar106;
        auVar35._16_4_ =
             (fVar29 + fVar107 +
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29) *
             auVar50._0_4_ + fVar107;
        auVar35._20_4_ =
             (fVar30 + fVar108 +
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30) *
             auVar50._4_4_ + fVar108;
        auVar35._24_4_ =
             (fVar31 + fVar20 +
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31) *
             auVar50._8_4_ + fVar20;
        auVar35._28_4_ = auVar18._28_4_ + fVar24 + auVar53._28_4_ + fVar24;
        auVar69 = vrcpps_avx(auVar35);
        fVar103 = auVar69._0_4_;
        fVar104 = auVar69._4_4_;
        fVar105 = auVar69._8_4_;
        fVar106 = auVar69._12_4_;
        fVar107 = auVar69._16_4_;
        fVar108 = auVar69._20_4_;
        fVar20 = auVar69._24_4_;
        auVar69._4_4_ = auVar35._4_4_ * (fVar104 + fVar104);
        auVar69._0_4_ = auVar35._0_4_ * (fVar103 + fVar103);
        auVar69._8_4_ = auVar35._8_4_ * (fVar105 + fVar105);
        auVar69._12_4_ = auVar35._12_4_ * (fVar106 + fVar106);
        auVar69._16_4_ = auVar35._16_4_ * (fVar107 + fVar107);
        auVar69._20_4_ = auVar35._20_4_ * (fVar108 + fVar108);
        auVar69._24_4_ = auVar35._24_4_ * (fVar20 + fVar20);
        auVar69._28_4_ = auVar35._28_4_;
        auVar18._8_4_ = 0x40000000;
        auVar18._0_8_ = 0x4000000040000000;
        auVar18._12_4_ = 0x40000000;
        auVar18._16_4_ = 0x40000000;
        auVar18._20_4_ = 0x40000000;
        auVar18._24_4_ = 0x40000000;
        auVar18._28_4_ = 0x40000000;
        auVar69 = vsubps_avx(auVar18,auVar69);
        auVar33._0_4_ = fVar103 + fVar103 + -1.0 + fVar103 * auVar69._0_4_;
        auVar33._4_4_ = fVar104 + fVar104 + -1.0 + fVar104 * auVar69._4_4_;
        auVar33._8_4_ = fVar105 + fVar105 + -1.0 + fVar105 * auVar69._8_4_;
        auVar33._12_4_ = fVar106 + fVar106 + -1.0 + fVar106 * auVar69._12_4_;
        auVar33._16_4_ = fVar107 + fVar107 + -1.0 + fVar107 * auVar69._16_4_;
        auVar33._20_4_ = fVar108 + fVar108 + -1.0 + fVar108 * auVar69._20_4_;
        auVar33._24_4_ = fVar20 + fVar20 + -1.0 + fVar20 * auVar69._24_4_;
        goto LAB_0031f152;
      case 6:
        fVar103 = *activation_params->data;
        fVar104 = *(float *)((long)activation_params->data + 4);
        auVar41._0_4_ = fVar103 * fVar101 + fVar104;
        auVar41._4_4_ = fVar103 * fVar102 + fVar104;
        auVar41._8_4_ = fVar103 * auVar21._8_4_ + fVar104;
        auVar41._12_4_ = fVar103 * auVar21._12_4_ + fVar104;
        auVar41._16_4_ = fVar103 * auVar21._16_4_ + fVar104;
        auVar41._20_4_ = fVar103 * auVar21._20_4_ + fVar104;
        auVar41._24_4_ = fVar103 * auVar21._24_4_ + fVar104;
        auVar41._28_4_ = fVar103 + fVar104;
        auVar41 = vmaxps_avx(auVar41,_DAT_00519320);
        auVar69 = vminps_avx(auVar41,auVar69);
        auVar33 = auVar69._0_28_;
LAB_0031f152:
        auVar21._4_4_ = auVar33._4_4_ * fVar102;
        auVar21._0_4_ = auVar33._0_4_ * fVar101;
        auVar21._8_4_ = auVar33._8_4_ * auVar21._8_4_;
        auVar21._12_4_ = auVar33._12_4_ * auVar21._12_4_;
        auVar21._16_4_ = auVar33._16_4_ * auVar21._16_4_;
        auVar21._20_4_ = auVar33._20_4_ * auVar21._20_4_;
        auVar21._24_4_ = auVar33._24_4_ * auVar21._24_4_;
      }
      *(undefined1 (*) [32])((long)top_blob->data + lVar9 * 0x20) = auVar21;
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return;
}

Assistant:

static void innerproduct_fp16s_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_fp16s_pack8_avx_f16c(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
        return;
    }
#endif

#if __F16C__
    const int num_input = bottom_blob.w * bottom_blob.elempack;
    const int num_output = top_blob.w;

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        __m256 _sum0 = _mm256_setzero_ps();
        __m256 _sum1 = _mm256_setzero_ps();
        __m256 _sum2 = _mm256_setzero_ps();
        __m256 _sum3 = _mm256_setzero_ps();
        __m256 _sum4 = _mm256_setzero_ps();
        __m256 _sum5 = _mm256_setzero_ps();
        __m256 _sum6 = _mm256_setzero_ps();
        __m256 _sum7 = _mm256_setzero_ps();

        if (bias_data_ptr)
        {
            _sum0 = _mm256_loadu_ps(bias_data_ptr + p * 8);
        }

        const unsigned short* kptr = weight_data_fp16.row<const unsigned short>(p);

        const float* sptr = bottom_blob;

        int i = 0;
        for (; i + 7 < num_input; i += 8)
        {
            __m256i _w01 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256 _val0 = _mm256_broadcast_ss(sptr);
            __m128i _w0_fp16 = _mm256_extractf128_si256(_w01, 0);
            __m256 _w0 = _mm256_cvtph_ps(_w0_fp16);
            _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
            __m128i _w1_fp16 = _mm256_extractf128_si256(_w01, 1);
            __m256 _w1 = _mm256_cvtph_ps(_w1_fp16);
            _sum1 = _mm256_comp_fmadd_ps(_val1, _w1, _sum1);

            __m256i _w23 = _mm256_lddqu_si256((const __m256i*)(kptr + 16));
            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
            __m128i _w2_fp16 = _mm256_extractf128_si256(_w23, 0);
            __m256 _w2 = _mm256_cvtph_ps(_w2_fp16);
            _sum2 = _mm256_comp_fmadd_ps(_val2, _w2, _sum2);

            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
            __m128i _w3_fp16 = _mm256_extractf128_si256(_w23, 1);
            __m256 _w3 = _mm256_cvtph_ps(_w3_fp16);
            _sum3 = _mm256_comp_fmadd_ps(_val3, _w3, _sum3);

            __m256i _w45 = _mm256_lddqu_si256((const __m256i*)(kptr + 32));
            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
            __m128i _w4_fp16 = _mm256_extractf128_si256(_w45, 0);
            __m256 _w4 = _mm256_cvtph_ps(_w4_fp16);
            _sum4 = _mm256_comp_fmadd_ps(_val4, _w4, _sum4);

            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
            __m128i _w5_fp16 = _mm256_extractf128_si256(_w45, 1);
            __m256 _w5 = _mm256_cvtph_ps(_w5_fp16);
            _sum5 = _mm256_comp_fmadd_ps(_val5, _w5, _sum5);

            __m256i _w67 = _mm256_lddqu_si256((const __m256i*)(kptr + 48));
            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
            __m128i _w6_fp16 = _mm256_extractf128_si256(_w67, 0);
            __m256 _w6 = _mm256_cvtph_ps(_w6_fp16);
            _sum6 = _mm256_comp_fmadd_ps(_val6, _w6, _sum6);

            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);
            __m128i _w7_fp16 = _mm256_extractf128_si256(_w67, 1);
            __m256 _w7 = _mm256_cvtph_ps(_w7_fp16);
            _sum7 = _mm256_comp_fmadd_ps(_val7, _w7, _sum7);

            sptr += 8;
            kptr += 64;
        }
        for (; i + 3 < num_input; i += 4)
        {
            __m256i _w01 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256 _val0 = _mm256_broadcast_ss(sptr);
            __m256 _w0 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w01, 0));
            _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
            __m256 _w1 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w01, 1));
            _sum1 = _mm256_comp_fmadd_ps(_val1, _w1, _sum1);

            __m256i _w23 = _mm256_lddqu_si256((const __m256i*)(kptr + 16));
            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
            __m256 _w2 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w23, 0));
            _sum2 = _mm256_comp_fmadd_ps(_val2, _w2, _sum2);

            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
            __m256 _w3 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w23, 1));
            _sum3 = _mm256_comp_fmadd_ps(_val3, _w3, _sum3);

            sptr += 4;
            kptr += 32;
        }
        for (; i < num_input; i++)
        {
            __m256 _val = _mm256_set1_ps(sptr[0]);
            __m256 _w = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)kptr));
            _sum0 = _mm256_comp_fmadd_ps(_val, _w, _sum0);

            sptr += 1;
            kptr += 8;
        }

        _sum0 = _mm256_add_ps(_sum0, _sum1);
        _sum2 = _mm256_add_ps(_sum2, _sum3);
        _sum4 = _mm256_add_ps(_sum4, _sum5);
        _sum6 = _mm256_add_ps(_sum6, _sum7);
        _sum0 = _mm256_add_ps(_sum0, _sum2);
        _sum4 = _mm256_add_ps(_sum4, _sum6);
        _sum0 = _mm256_add_ps(_sum0, _sum4);

        _sum0 = activation_avx(_sum0, activation_type, activation_params);

        float* outptr = top_blob;
        _mm256_storeu_ps(outptr + p * 8, _sum0);
    }
#else  // __F16C__
    (void)bottom_blob;
    (void)top_blob;
    (void)weight_data_fp16;
    (void)bias_data;
    (void)activation_type;
    (void)activation_params;
    (void)opt;
#endif // __F16C__
}